

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float __thiscall
pbrt::TrowbridgeReitzDistribution::D(TrowbridgeReitzDistribution *this,Vector3f *wm)

{
  float fVar1;
  Float FVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  undefined1 auVar10 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar9 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  Vector3f w;
  Float FVar7;
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  
  fVar1 = (wm->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar6 = fVar1 * fVar1;
  auVar9._0_12_ = ZEXT812(0);
  auVar9._12_4_ = 0;
  fVar8 = 0.0;
  auVar9 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar6)),auVar9);
  fVar12 = auVar9._0_4_ / fVar6;
  if ((ABS(fVar12) != INFINITY) && (1e-16 <= fVar6 * fVar6)) {
    uVar3 = (wm->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar4 = (wm->super_Tuple3<pbrt::Vector3,_float>).y;
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
    w.super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
    FVar7 = CosPhi(w);
    FVar2 = this->alpha_x;
    auVar11._0_4_ = SinPhi((Vector3f)wm->super_Tuple3<pbrt::Vector3,_float>);
    auVar11._4_60_ = extraout_var;
    auVar5._4_4_ = extraout_XMM0_Db;
    auVar5._0_4_ = FVar7;
    auVar5._8_4_ = extraout_XMM0_Dc;
    auVar5._12_4_ = extraout_XMM0_Dd;
    auVar9 = vinsertps_avx(auVar5,auVar11._0_16_,0x10);
    auVar5 = vinsertps_avx(ZEXT416((uint)FVar2),ZEXT416((uint)this->alpha_y),0x10);
    auVar10._0_4_ = auVar9._0_4_ * auVar9._0_4_;
    auVar10._4_4_ = auVar9._4_4_ * auVar9._4_4_;
    auVar10._8_4_ = auVar9._8_4_ * auVar9._8_4_;
    auVar10._12_4_ = auVar9._12_4_ * auVar9._12_4_;
    auVar13._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar13._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar13._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar13._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    auVar9 = vdivps_avx(auVar10,auVar13);
    auVar9 = vhaddps_avx(auVar9,auVar9);
    fVar1 = auVar9._0_4_ * fVar12 + 1.0;
    fVar8 = 1.0 / (this->alpha_y * this->alpha_x * 3.1415927 * fVar6 * fVar6 * fVar1 * fVar1);
  }
  return fVar8;
}

Assistant:

PBRT_CPU_GPU inline Float D(const Vector3f &wm) const {
        Float tan2Theta = Tan2Theta(wm);
        if (IsInf(tan2Theta))
            return 0;
        Float cos4Theta = Cos2Theta(wm) * Cos2Theta(wm);
        if (cos4Theta < 1e-16f)
            return 0;
        Float e =
            tan2Theta * (Sqr(CosPhi(wm)) / Sqr(alpha_x) + Sqr(SinPhi(wm)) / Sqr(alpha_y));
        return 1 / (Pi * alpha_x * alpha_y * cos4Theta * Sqr(1 + e));
    }